

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

void xmlFreeStreamComp(xmlStreamCompPtr comp)

{
  if (comp->steps != (xmlStreamStepPtr)0x0) {
    (*xmlFree)(comp->steps);
  }
  if (comp->dict != (xmlDictPtr)0x0) {
    xmlDictFree(comp->dict);
  }
  (*xmlFree)(comp);
  return;
}

Assistant:

static void
xmlFreeStreamComp(xmlStreamCompPtr comp) {
    if (comp != NULL) {
        if (comp->steps != NULL)
	    xmlFree(comp->steps);
	if (comp->dict != NULL)
	    xmlDictFree(comp->dict);
        xmlFree(comp);
    }
}